

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

LogHelper *
util::operator<<(LogHelper *h,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  if (h->clearline == true) {
    h->clearline = false;
    operator<<(h,clearline);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (h->screen,(t->_M_dataplus)._M_p,t->_M_string_length);
  if ((h->file != (ostream *)0x0) && (h->statusmsg == false)) {
    std::__ostream_insert<char,std::char_traits<char>>
              (h->file,(t->_M_dataplus)._M_p,t->_M_string_length);
  }
  return h;
}

Assistant:

LogHelper& operator<<(LogHelper& h, const T& t)
{
    if (h.clearline)
    {
        h.clearline = false;
        h << ttycmd::clearline;
    }

    *h.screen << t;
    if (h.file && !h.statusmsg) *h.file << t;
    return h;
}